

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

fdb_status fdb_iterator_close(fdb_iterator *iterator)

{
  uint32_t *puVar1;
  fdb_status fVar2;
  
  fVar2 = FDB_RESULT_INVALID_HANDLE;
  if ((iterator != (fdb_iterator *)0x0) && (iterator->handle != (fdb_kvs_handle *)0x0)) {
    if (iterator->hbtrie_iterator != (hbtrie_iterator *)0x0) {
      hbtrie_iterator_free(iterator->hbtrie_iterator);
      free(iterator->hbtrie_iterator);
    }
    if (iterator->seqtree_iterator != (btree_iterator *)0x0) {
      btree_iterator_free(iterator->seqtree_iterator);
      free(iterator->seqtree_iterator);
    }
    if (iterator->seqtrie_iterator != (hbtrie_iterator *)0x0) {
      hbtrie_iterator_free(iterator->seqtrie_iterator);
      free(iterator->seqtrie_iterator);
    }
    free(iterator->start_key);
    free(iterator->end_key);
    puVar1 = &iterator->handle->num_iterators;
    *puVar1 = *puVar1 - 1;
    wal_itr_close(iterator->wal_itr);
    if ((iterator->snapshot_handle == false) &&
       (fVar2 = fdb_kvs_close(iterator->handle), fVar2 != FDB_RESULT_SUCCESS)) {
      fdb_log_impl(&iterator->handle->log_callback,2,fVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/iterator.cc"
                   ,"fdb_iterator_close",0x8ea,
                   "Failed to close the KV Store from a database file \'%s\' as part of closing the iterator"
                   ,iterator->handle->file->filename);
    }
    free(iterator->_key);
    free(iterator);
    fVar2 = FDB_RESULT_SUCCESS;
  }
  return fVar2;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_close(fdb_iterator *iterator)
{
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    LATENCY_STAT_START();
    if (iterator->hbtrie_iterator) {
        hbtrie_iterator_free(iterator->hbtrie_iterator);
        free(iterator->hbtrie_iterator);
    }

    if (iterator->seqtree_iterator) {
        btree_iterator_free(iterator->seqtree_iterator);
        free(iterator->seqtree_iterator);
    }
    if (iterator->seqtrie_iterator) {
        hbtrie_iterator_free(iterator->seqtrie_iterator);
        free(iterator->seqtrie_iterator);
    }

    if (iterator->start_key) {
        free(iterator->start_key);
    }

    if (iterator->end_key) {
        free(iterator->end_key);
    }

    --iterator->handle->num_iterators; // Decrement the iterator counter of the KV handle
    wal_itr_close(iterator->wal_itr);

    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_CLOSE);

    if (!iterator->snapshot_handle) {
        // Close the opened handle in the iterator,
        // if the handle is not for snapshot.
        fdb_status fs = fdb_kvs_close(iterator->handle);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(&iterator->handle->log_callback, FDB_LOG_ERROR, fs,
                    "Failed to close the KV Store from a database file '%s' as "
                    "part of closing the iterator",
                    iterator->handle->file->filename);
        }
    }

    free(iterator->_key);
    free(iterator);
    return FDB_RESULT_SUCCESS;
}